

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::prepend_copy(xml_node *this,xml_attribute *proto)

{
  xml_node_struct *pxVar1;
  xml_attribute xVar2;
  uint uVar3;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar4;
  xml_attribute a;
  xml_attribute local_28;
  xml_attribute local_20;
  
  if (((proto->_attr != (xml_attribute_struct *)0x0) &&
      (pxVar1 = this->_root, pxVar1 != (xml_node_struct *)0x0)) &&
     ((uVar3 = (uint)pxVar1->header & 0xf, uVar3 == 2 || (uVar3 == 7)))) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(pxVar1);
    pxVar4 = impl::anon_unknown_0::allocate_attribute(alloc);
    xml_attribute::xml_attribute(&local_20,pxVar4);
    if (local_20._attr != (xml_attribute_struct *)0x0) {
      pxVar1 = this->_root;
      pxVar4 = pxVar1->first_attribute;
      xVar2._attr = local_20._attr;
      if (pxVar4 != (xml_attribute_struct *)0x0) {
        (local_20._attr)->prev_attribute_c = pxVar4->prev_attribute_c;
        xVar2._attr = pxVar4;
      }
      (xVar2._attr)->prev_attribute_c = local_20._attr;
      (local_20._attr)->next_attribute = pxVar4;
      pxVar1->first_attribute = local_20._attr;
      impl::anon_unknown_0::node_copy_attribute(local_20._attr,proto->_attr);
      return (xml_attribute)local_20._attr;
    }
  }
  xml_attribute::xml_attribute(&local_28);
  return (xml_attribute)local_28._attr;
}

Assistant:

PUGI_IMPL_FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}